

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

size_t __thiscall
capnp::computeSerializedSizeInWords
          (capnp *this,ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t sVar1;
  long lVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  Fault f;
  Fault local_10;
  
  pAVar3 = segments.ptr;
  if (pAVar3 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar1 = ((ulong)pAVar3 >> 1) + 1;
    lVar2 = 0;
    do {
      sVar1 = sVar1 + *(long *)(this + lVar2 + 8);
      lVar2 = lVar2 + 0x10;
    } while ((long)pAVar3 * 0x10 != lVar2);
    return sVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0xa0,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

size_t computeSerializedSizeInWords(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  size_t totalSize = segments.size() / 2 + 1;

  for (auto& segment: segments) {
    totalSize += segment.size();
  }

  return totalSize;
}